

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  long in_RSI;
  long in_RDI;
  string *in_stack_00000028;
  Token *in_stack_00000030;
  Value decoded;
  string decoded_string;
  Value *in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff90;
  string local_38 [32];
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_38);
  bVar1 = decodeString(decoded.value_,in_stack_00000030,in_stack_00000028);
  if (bVar1) {
    Value::Value(in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68);
    pVVar2 = currentValue((OurReader *)0x14993d);
    Value::swapPayload(pVVar2,in_stack_ffffffffffffff68);
    pVVar2 = currentValue((OurReader *)0x14995f);
    Value::setOffsetStart(pVVar2,*(long *)(local_18 + 8) - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((OurReader *)0x149997);
    Value::setOffsetLimit(pVVar2,*(long *)(local_18 + 0x10) - *(long *)(in_RDI + 0xc0));
    local_1 = 1;
    Value::~Value(in_stack_ffffffffffffff90);
  }
  else {
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::decodeString(Token& token) {
  std::string decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}